

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::lerp
          (LightNodeImpl<embree::SceneGraph::QuadLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  long *plVar42;
  _func_int **pp_Var43;
  long *in_RDX;
  long *plVar44;
  float fVar45;
  
  bVar1 = true;
  if (*in_RDX == 0) {
    plVar44 = (long *)0x0;
  }
  else {
    plVar42 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo);
    plVar44 = (long *)0x0;
    if (plVar42 != (long *)0x0) {
      (**(code **)(*plVar42 + 0x10))(plVar42);
      bVar1 = false;
      plVar44 = plVar42;
    }
  }
  pp_Var43 = (_func_int **)alignedMalloc(0xd0,0x10);
  fVar45 = 1.0 - f;
  fVar2 = *(float *)(plVar44 + 0x10);
  fVar3 = *(float *)((long)plVar44 + 0x84);
  fVar4 = *(float *)(plVar44 + 0x11);
  fVar5 = *(float *)((long)plVar44 + 0x8c);
  fVar6 = *(float *)&light1_in[0x10].ptr;
  fVar7 = *(float *)((long)&light1_in[0x10].ptr + 4);
  fVar8 = *(float *)&light1_in[0x11].ptr;
  fVar9 = *(float *)((long)&light1_in[0x11].ptr + 4);
  fVar10 = *(float *)(plVar44 + 0x12);
  fVar11 = *(float *)((long)plVar44 + 0x94);
  fVar12 = *(float *)(plVar44 + 0x13);
  fVar13 = *(float *)((long)plVar44 + 0x9c);
  fVar14 = *(float *)&light1_in[0x12].ptr;
  fVar15 = *(float *)((long)&light1_in[0x12].ptr + 4);
  fVar16 = *(float *)&light1_in[0x13].ptr;
  fVar17 = *(float *)((long)&light1_in[0x13].ptr + 4);
  fVar18 = *(float *)(plVar44 + 0x14);
  fVar19 = *(float *)((long)plVar44 + 0xa4);
  fVar20 = *(float *)(plVar44 + 0x15);
  fVar21 = *(float *)((long)plVar44 + 0xac);
  fVar22 = *(float *)&light1_in[0x14].ptr;
  fVar23 = *(float *)((long)&light1_in[0x14].ptr + 4);
  fVar24 = *(float *)&light1_in[0x15].ptr;
  fVar25 = *(float *)((long)&light1_in[0x15].ptr + 4);
  fVar26 = *(float *)(plVar44 + 0x16);
  fVar27 = *(float *)((long)plVar44 + 0xb4);
  fVar28 = *(float *)(plVar44 + 0x17);
  fVar29 = *(float *)((long)plVar44 + 0xbc);
  fVar30 = *(float *)&light1_in[0x16].ptr;
  fVar31 = *(float *)((long)&light1_in[0x16].ptr + 4);
  fVar32 = *(float *)&light1_in[0x17].ptr;
  fVar33 = *(float *)((long)&light1_in[0x17].ptr + 4);
  fVar34 = *(float *)(plVar44 + 0x18);
  fVar35 = *(float *)((long)plVar44 + 0xc4);
  fVar36 = *(float *)(plVar44 + 0x19);
  fVar37 = *(float *)((long)plVar44 + 0xcc);
  fVar38 = *(float *)&light1_in[0x18].ptr;
  fVar39 = *(float *)((long)&light1_in[0x18].ptr + 4);
  fVar40 = *(float *)&light1_in[0x19].ptr;
  fVar41 = *(float *)((long)&light1_in[0x19].ptr + 4);
  pp_Var43[1] = (_func_int *)0x0;
  pp_Var43[2] = (_func_int *)(pp_Var43 + 4);
  pp_Var43[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var43 + 4) = 0;
  pp_Var43[6] = (_func_int *)(pp_Var43 + 8);
  pp_Var43[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var43 + 8) = 0;
  pp_Var43[10] = (_func_int *)0x0;
  *(undefined2 *)(pp_Var43 + 0xb) = 0;
  *(undefined4 *)((long)pp_Var43 + 0x5c) = 0xffffffff;
  pp_Var43[0xc] = (_func_int *)0x0;
  *pp_Var43 = (_func_int *)&PTR__Node_002cb008;
  *(undefined4 *)(pp_Var43 + 0xe) = 6;
  *(float *)(pp_Var43 + 0x10) = fVar6 * fVar45 + fVar2 * f;
  *(float *)((long)pp_Var43 + 0x84) = fVar7 * fVar45 + fVar3 * f;
  *(float *)(pp_Var43 + 0x11) = fVar8 * fVar45 + fVar4 * f;
  *(float *)((long)pp_Var43 + 0x8c) = fVar9 * fVar45 + fVar5 * f;
  *(float *)(pp_Var43 + 0x12) = fVar14 * fVar45 + fVar10 * f;
  *(float *)((long)pp_Var43 + 0x94) = fVar15 * fVar45 + fVar11 * f;
  *(float *)(pp_Var43 + 0x13) = fVar16 * fVar45 + fVar12 * f;
  *(float *)((long)pp_Var43 + 0x9c) = fVar17 * fVar45 + fVar13 * f;
  *(float *)(pp_Var43 + 0x14) = fVar22 * fVar45 + fVar18 * f;
  *(float *)((long)pp_Var43 + 0xa4) = fVar23 * fVar45 + fVar19 * f;
  *(float *)(pp_Var43 + 0x15) = fVar24 * fVar45 + fVar20 * f;
  *(float *)((long)pp_Var43 + 0xac) = fVar25 * fVar45 + fVar21 * f;
  *(float *)(pp_Var43 + 0x16) = fVar30 * fVar45 + fVar26 * f;
  *(float *)((long)pp_Var43 + 0xb4) = fVar31 * fVar45 + fVar27 * f;
  *(float *)(pp_Var43 + 0x17) = fVar32 * fVar45 + fVar28 * f;
  *(float *)((long)pp_Var43 + 0xbc) = fVar33 * fVar45 + fVar29 * f;
  *(float *)(pp_Var43 + 0x18) = fVar45 * fVar38 + f * fVar34;
  *(float *)((long)pp_Var43 + 0xc4) = fVar45 * fVar39 + f * fVar35;
  *(float *)(pp_Var43 + 0x19) = fVar45 * fVar40 + f * fVar36;
  *(float *)((long)pp_Var43 + 0xcc) = fVar45 * fVar41 + f * fVar37;
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = pp_Var43;
  LOCK();
  pp_Var43[1] = pp_Var43[1] + 1;
  UNLOCK();
  if (!bVar1) {
    (**(code **)(*plVar44 + 0x18))(plVar44);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }